

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzidentifyrefpattern.cpp
# Opt level: O0

int __thiscall TPZIdentifyRefPattern::UniformSubElem(TPZIdentifyRefPattern *this,int eltype)

{
  ostream *this_00;
  void *this_01;
  int in_ESI;
  int local_4;
  
  switch(in_ESI) {
  case 0:
    local_4 = 1;
    break;
  case 1:
    local_4 = 2;
    break;
  case 2:
    local_4 = 4;
    break;
  case 3:
    local_4 = 4;
    break;
  case 4:
    local_4 = 6;
    break;
  case 5:
    local_4 = 10;
    break;
  case 6:
    local_4 = 8;
    break;
  case 7:
    local_4 = 8;
    break;
  default:
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "TPZIdentifyRefPattern::UniformSubElem ERROR unknown eltype : ");
    this_01 = (void *)std::ostream::operator<<(this_00,in_ESI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int TPZIdentifyRefPattern::UniformSubElem( int eltype){
	switch (eltype) {
		case (EPoint)         : return TPZRefPoint::NSubEl;
		case (EOned)          : return TPZRefLinear::NSubEl;
		case (ETriangle)      : return TPZRefTriangle::NSubEl;
		case (EQuadrilateral) : return TPZRefQuad::NSubEl;
		case (ETetraedro)     : return TPZRefTetrahedra::NSubEl;
		case (EPiramide)      : return TPZRefPyramid::NSubEl;
		case (EPrisma)        : return TPZRefPrism::NSubEl;
		case (ECube)          : return TPZRefCube::NSubEl;
	}
	PZError << "TPZIdentifyRefPattern::UniformSubElem ERROR unknown eltype : " << eltype << endl;
	return (-1);
}